

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_BoxFree(Acec_Box_t *pBox)

{
  Acec_Box_t *pBox_local;
  
  Vec_WecFreeP(&pBox->vAdds);
  Vec_WecFreeP(&pBox->vLeafLits);
  Vec_WecFreeP(&pBox->vRootLits);
  Vec_WecFreeP(&pBox->vUnique);
  Vec_WecFreeP(&pBox->vShared);
  if (pBox != (Acec_Box_t *)0x0) {
    free(pBox);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_BoxFree( Acec_Box_t * pBox )
{
    Vec_WecFreeP( &pBox->vAdds );
    Vec_WecFreeP( &pBox->vLeafLits );
    Vec_WecFreeP( &pBox->vRootLits );
    Vec_WecFreeP( &pBox->vUnique );
    Vec_WecFreeP( &pBox->vShared );
    ABC_FREE( pBox );
}